

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Manifest.cpp
# Opt level: O3

bool __thiscall llbuild::ninja::Rule::isValidParameterName(Rule *this,StringRef name)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  bool bVar5;
  
  bVar5 = false;
  switch(name.Data) {
  case (char *)0x4:
    if (*(int *)&(this->name)._M_dataplus._M_p != 0x73706564) {
      return *(int *)&(this->name)._M_dataplus._M_p == 0x6c6f6f70;
    }
    return true;
  default:
    goto switchD_0014283a_caseD_5;
  case (char *)0x6:
    uVar1 = *(uint *)&(this->name)._M_dataplus._M_p ^ 0x74736572;
    uVar3 = *(ushort *)((long)&(this->name)._M_dataplus._M_p + 4) ^ 0x7461;
    goto LAB_001428bb;
  case (char *)0x7:
    if (*(int *)((long)&(this->name)._M_dataplus._M_p + 3) == 0x646e616d &&
        *(int *)&(this->name)._M_dataplus._M_p == 0x6d6d6f63) {
      return true;
    }
    if (*(int *)((long)&(this->name)._M_dataplus._M_p + 3) == 0x656c6966 &&
        *(int *)&(this->name)._M_dataplus._M_p == 0x66706564) {
      return true;
    }
    uVar1 = *(uint *)&(this->name)._M_dataplus._M_p ^ 0x66707372;
    uVar3 = *(uint *)((long)&(this->name)._M_dataplus._M_p + 3) ^ 0x656c6966;
LAB_001428bb:
    return uVar3 == 0 && uVar1 == 0;
  case (char *)0x9:
    uVar2 = (ulong)(this->name)._M_dataplus._M_p ^ 0x6f746172656e6567;
    uVar4 = (ulong)(byte)(this->name)._M_string_length ^ 0x72;
    break;
  case (char *)0xb:
    uVar2 = (ulong)(this->name)._M_dataplus._M_p ^ 0x7470697263736564;
    uVar4 = *(ulong *)((long)&(this->name)._M_dataplus._M_p + 3) ^ 0x6e6f697470697263;
    break;
  case (char *)0xf:
    uVar2 = (ulong)(this->name)._M_dataplus._M_p ^ 0x5f656c6966707372;
    uVar4 = *(ulong *)((long)&(this->name)._M_dataplus._M_p + 7) ^ 0x746e65746e6f635f;
  }
  bVar5 = uVar4 == 0 && uVar2 == 0;
switchD_0014283a_caseD_5:
  return bVar5;
}

Assistant:

bool Rule::isValidParameterName(StringRef name) {
  return name == "command" ||
    name == "description" ||
    name == "deps" ||
    name == "depfile" ||
    name == "generator" ||
    name == "pool" ||
    name == "restat" ||
    name == "rspfile" ||
    name == "rspfile_content";
}